

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

int VP8LGetHistoImageSymbols
              (int xsize,int ysize,VP8LBackwardRefs *refs,int quality,int low_effort,
              int histogram_bits,int cache_bits,VP8LHistogramSet *image_histo,
              VP8LHistogram *tmp_histo,uint16_t *histogram_symbols)

{
  HistogramPair *pHVar1;
  HistogramPair *pHVar2;
  PixOrCopy *pPVar3;
  ushort uVar4;
  VP8LHistogram *pVVar5;
  VP8LHistogram *pVVar6;
  uint32_t *__dest;
  VP8LHistogram **ppVVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  uint16_t uVar11;
  int iVar12;
  uint32_t uVar13;
  VP8LHistogramSet *set;
  void *pvVar14;
  long lVar15;
  ushort uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  uint16_t uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  short sVar26;
  ushort *puVar27;
  byte bVar28;
  short sVar29;
  uint uVar30;
  short sVar31;
  void *__s;
  PixOrCopy *v;
  uint64_t nmemb;
  ulong uVar32;
  uint uVar33;
  size_t __nmemb;
  HistogramPair *pHVar34;
  int iVar35;
  uint uVar36;
  VP8LHistogram **ppVVar37;
  char cVar38;
  float fVar39;
  double dVar40;
  double dVar41;
  double dVar44;
  undefined1 auVar42 [16];
  int iVar45;
  ulong extraout_XMM0_Qb;
  undefined1 auVar43 [16];
  double dVar46;
  double dVar48;
  undefined1 auVar47 [16];
  double dVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double range;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  double range_1;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar67;
  int iVar70;
  undefined1 auVar68 [16];
  int iVar71;
  undefined1 auVar69 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar72 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar73 [16];
  double dVar74;
  int num_used;
  uint16_t *bin_map;
  int num_used_orig;
  VP8LHistogram *local_1c8;
  uint local_1bc;
  HistogramPair *local_1b8;
  HistoQueue local_1b0;
  double local_1a0;
  undefined1 local_198 [16];
  int local_180;
  uint local_17c;
  void *local_178;
  VP8LHistogramSet *local_170;
  ulong local_168;
  uint64_t local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  VP8LBackwardRefs *local_148;
  undefined8 uStack_140;
  VP8LRefsCursor local_138 [11];
  
  bVar28 = (byte)histogram_bits;
  iVar17 = 1 << (bVar28 & 0x1f);
  uVar30 = ((ysize + iVar17) - 1U >> (bVar28 & 0x1f)) * ((xsize + iVar17) - 1U >> (bVar28 & 0x1f));
  if (histogram_bits == 0) {
    uVar30 = 1;
  }
  local_180 = quality;
  local_148 = refs;
  set = VP8LAllocateHistogramSet(uVar30,cache_bits);
  local_158._0_4_ = 0x40;
  if (low_effort != 0) {
    local_158._0_4_ = 4;
  }
  local_158._4_4_ = 0;
  local_178 = WebPSafeMalloc((long)(int)(uVar30 * 2),8);
  local_1bc = uVar30;
  local_1a0 = (double)(ulong)uVar30;
  if (local_178 == (void *)0x0 || set == (VP8LHistogramSet *)0x0) goto LAB_0014b7ff;
  local_1b8 = (HistogramPair *)CONCAT44(local_1b8._4_4_,low_effort);
  local_198._0_4_ = (xsize + (1 << (bVar28 & 0x1f))) - 1U >> (bVar28 & 0x1f);
  ppVVar37 = set->histograms;
  VP8LRefsCursorInit(local_138,local_148);
  local_170 = set;
  VP8LHistogramSetClear(set);
  if (local_138[0].cur_pos != (PixOrCopy *)0x0) {
    iVar17 = 0;
    iVar35 = 0;
    do {
      pPVar3 = local_138[0].cur_pos;
      VP8LHistogramAddSinglePixOrCopy
                (ppVVar37[(iVar17 >> (bVar28 & 0x1f)) +
                          (iVar35 >> (bVar28 & 0x1f)) * local_198._0_4_],local_138[0].cur_pos,
                 (_func_int_int_int *)0x0,0);
      for (iVar17 = (uint)pPVar3->len + iVar17; xsize <= iVar17; iVar17 = iVar17 - xsize) {
        iVar35 = iVar35 + 1;
      }
      local_138[0].cur_pos = local_138[0].cur_pos + 1;
      if (local_138[0].cur_pos == local_138[0].last_pos_) {
        VP8LRefsCursorNextBlock(local_138);
      }
    } while (local_138[0].cur_pos != (PixOrCopy *)0x0);
  }
  local_138[0].cur_pos = (PixOrCopy *)CONCAT44(local_138[0].cur_pos._4_4_,SUB84(local_1a0,0));
  set = local_170;
  if (0 < local_170->max_size) {
    local_198._0_8_ = local_170->histograms;
    ppVVar37 = image_histo->histograms;
    lVar19 = 0;
    uVar21 = 0;
    do {
      pVVar5 = *(VP8LHistogram **)(local_198._0_8_ + lVar19 * 8);
      UpdateHistogramCost(pVVar5);
      if ((((pVVar5->is_used_[0] == '\0') && (pVVar5->is_used_[1] == '\0')) &&
          (pVVar5->is_used_[2] == '\0')) &&
         ((pVVar5->is_used_[3] == '\0' && (pVVar5->is_used_[4] == '\0')))) {
        HistogramSetRemoveHistogram(image_histo,(int)lVar19,(int *)&local_1bc);
        HistogramSetRemoveHistogram(set,(int)lVar19,(int *)local_138);
        uVar11 = 0xffff;
      }
      else {
        pVVar6 = ppVVar37[lVar19];
        iVar17 = pVVar6->palette_code_bits_;
        iVar12 = (4 << ((byte)iVar17 & 0x1f)) + 0x1138;
        iVar35 = (1 << ((byte)iVar17 & 0x1f)) + 0x118;
        if (iVar17 < 1) {
          iVar35 = 0x118;
        }
        __dest = pVVar6->literal_;
        if (iVar17 < 1) {
          iVar12 = 0x1138;
        }
        memcpy(pVVar6,pVVar5,(long)iVar12);
        set = local_170;
        pVVar6->literal_ = __dest;
        memcpy(__dest,pVVar5->literal_,(long)iVar35 << 2);
        uVar11 = uVar21;
        uVar21 = uVar21 + 1;
      }
      histogram_symbols[lVar19] = uVar11;
      lVar19 = lVar19 + 1;
    } while (lVar19 < set->max_size);
  }
  pvVar14 = local_178;
  uVar20 = (ulong)local_1bc;
  uVar30 = (uint)local_158 * 2;
  bVar8 = SBORROW4(local_1bc,uVar30) == (int)(local_1bc + (uint)local_158 * -2) < 0;
  bVar28 = local_180 < 100 && (local_1bc != uVar30 && bVar8);
  if (local_180 < 100 && (local_1bc != uVar30 && bVar8)) {
    if (local_180 < 0x5a) {
      dVar74 = *(double *)(&DAT_0015c3f0 + (ulong)(0x100 < local_1a0._0_4_) * 8);
      if (0x200 < local_1a0._0_4_) {
        dVar74 = dVar74 * 0.5;
      }
      if (0x400 < local_1a0._0_4_) {
        dVar74 = dVar74 * 0.5;
      }
      if (local_180 < 0x33) {
        dVar74 = dVar74 * 0.5;
      }
    }
    else {
      dVar74 = 0.16;
    }
    ppVVar37 = image_histo->histograms;
    iVar17 = image_histo->size;
    lVar19 = (long)iVar17;
    local_160 = CONCAT71(local_160._1_7_,bVar28);
    if (lVar19 < 1) {
      dVar48 = 0.0;
      dVar44 = 1e+38;
      dVar40 = 1e+38;
      dVar46 = 0.0;
      dVar49 = 1e+38;
      dVar41 = 0.0;
    }
    else {
      auVar56 = ZEXT816(0);
      auVar57 = ZEXT816(0x47d2ced32a16a1b1);
      dVar41 = 0.0;
      lVar15 = 0;
      auVar54 = _DAT_0015c400;
      do {
        pVVar5 = ppVVar37[lVar15];
        if (pVVar5 != (VP8LHistogram *)0x0) {
          dVar40 = pVVar5->literal_cost_;
          dVar44 = dVar40;
          if (dVar40 <= dVar41) {
            dVar44 = dVar41;
          }
          if (auVar57._0_8_ <= dVar40) {
            dVar40 = auVar57._0_8_;
          }
          auVar72._0_8_ = pVVar5->red_cost_;
          auVar72._8_8_ = pVVar5->blue_cost_;
          auVar56 = maxpd(auVar72,auVar56);
          auVar54 = minpd(auVar72,auVar54);
          auVar57._8_8_ = 0;
          auVar57._0_8_ = dVar40;
          dVar41 = dVar44;
        }
        dVar46 = auVar56._0_8_;
        dVar40 = auVar54._0_8_;
        dVar49 = auVar57._0_8_;
        lVar15 = lVar15 + 1;
      } while (lVar19 != lVar15);
      dVar44 = auVar54._8_8_;
      dVar48 = auVar56._8_8_;
    }
    lVar15 = (long)local_1a0._0_4_;
    if (0 < iVar17) {
      lVar24 = 0;
      do {
        pVVar5 = ppVVar37[lVar24];
        if (pVVar5 != (VP8LHistogram *)0x0) {
          sVar26 = (short)(int)(((pVVar5->literal_cost_ - dVar49) * 3.999999) / (dVar41 - dVar49));
          if (dVar41 - dVar49 <= 0.0) {
            sVar26 = 0;
          }
          if ((int)local_1b8 == 0) {
            sVar31 = (short)((int)(((pVVar5->red_cost_ - dVar40) * 3.999999) / (dVar46 - dVar40)) <<
                            2);
            if (dVar46 - dVar40 <= 0.0) {
              sVar31 = 0;
            }
            sVar29 = (short)(int)(((pVVar5->blue_cost_ - dVar44) * 3.999999) / (dVar48 - dVar44));
            if (dVar48 - dVar44 <= 0.0) {
              sVar29 = 0;
            }
            sVar26 = sVar26 * 0x10 + sVar29 + sVar31;
          }
          *(short *)((long)local_178 + lVar24 * 2) = sVar26;
        }
        lVar24 = lVar24 + 1;
      } while (lVar19 != lVar24);
    }
    auVar54 = _DAT_00156820;
    local_1c8 = tmp_histo;
    uVar25 = 0;
    do {
      *(undefined4 *)((long)&local_138[0].cur_pos + uVar25 * 4) = 0xffff;
      uVar25 = uVar25 + 1;
    } while ((uint)local_158 != uVar25);
    if (0 < (int)local_1bc) {
      lVar19 = uVar20 - 1;
      auVar42._8_4_ = (int)lVar19;
      auVar42._0_8_ = lVar19;
      auVar42._12_4_ = (int)((ulong)lVar19 >> 0x20);
      uVar25 = 0;
      auVar42 = auVar42 ^ _DAT_00156820;
      auVar55._8_4_ = 0xffffffff;
      auVar55._0_8_ = 0xffffffffffffffff;
      auVar55._12_4_ = 0xffffffff;
      auVar56 = _DAT_00159440;
      auVar50 = _DAT_00159450;
      auVar52 = _DAT_00157e40;
      auVar53 = _DAT_001555f0;
      do {
        auVar57 = auVar53 ^ auVar54;
        iVar35 = auVar42._0_4_;
        iVar67 = -(uint)(iVar35 < auVar57._0_4_);
        iVar12 = auVar42._4_4_;
        auVar58._4_4_ = -(uint)(iVar12 < auVar57._4_4_);
        iVar71 = auVar42._8_4_;
        iVar70 = -(uint)(iVar71 < auVar57._8_4_);
        iVar45 = auVar42._12_4_;
        auVar58._12_4_ = -(uint)(iVar45 < auVar57._12_4_);
        auVar64._4_4_ = iVar67;
        auVar64._0_4_ = iVar67;
        auVar64._8_4_ = iVar70;
        auVar64._12_4_ = iVar70;
        auVar72 = pshuflw(in_XMM11,auVar64,0xe8);
        auVar60._4_4_ = -(uint)(auVar57._4_4_ == iVar12);
        auVar60._12_4_ = -(uint)(auVar57._12_4_ == iVar45);
        auVar60._0_4_ = auVar60._4_4_;
        auVar60._8_4_ = auVar60._12_4_;
        auVar73 = pshuflw(in_XMM12,auVar60,0xe8);
        auVar58._0_4_ = auVar58._4_4_;
        auVar58._8_4_ = auVar58._12_4_;
        auVar57 = pshuflw(auVar72,auVar58,0xe8);
        auVar57 = (auVar57 | auVar73 & auVar72) ^ auVar55;
        auVar57 = packssdw(auVar57,auVar57);
        sVar26 = (short)uVar25;
        if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(short *)((long)local_178 + uVar25 * 2 + lVar15 * 2) = sVar26;
        }
        auVar58 = auVar60 & auVar64 | auVar58;
        auVar57 = packssdw(auVar58,auVar58);
        auVar57 = packssdw(auVar57 ^ auVar55,auVar57 ^ auVar55);
        if ((auVar57._0_4_ >> 0x10 & 1) != 0) {
          *(short *)((long)local_178 + uVar25 * 2 + lVar15 * 2 + 2) = sVar26 + 1;
        }
        auVar57 = auVar52 ^ auVar54;
        iVar67 = -(uint)(iVar35 < auVar57._0_4_);
        auVar68._4_4_ = -(uint)(iVar12 < auVar57._4_4_);
        iVar70 = -(uint)(iVar71 < auVar57._8_4_);
        auVar68._12_4_ = -(uint)(iVar45 < auVar57._12_4_);
        auVar59._4_4_ = iVar67;
        auVar59._0_4_ = iVar67;
        auVar59._8_4_ = iVar70;
        auVar59._12_4_ = iVar70;
        auVar63._4_4_ = -(uint)(auVar57._4_4_ == iVar12);
        auVar63._12_4_ = -(uint)(auVar57._12_4_ == iVar45);
        auVar63._0_4_ = auVar63._4_4_;
        auVar63._8_4_ = auVar63._12_4_;
        auVar68._0_4_ = auVar68._4_4_;
        auVar68._8_4_ = auVar68._12_4_;
        auVar57 = auVar63 & auVar59 | auVar68;
        auVar57 = packssdw(auVar57,auVar57);
        auVar57 = packssdw(auVar57 ^ auVar55,auVar57 ^ auVar55);
        if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(short *)((long)local_178 + uVar25 * 2 + lVar15 * 2 + 4) = sVar26 + 2;
        }
        auVar60 = pshufhw(auVar59,auVar59,0x84);
        auVar64 = pshufhw(auVar63,auVar63,0x84);
        auVar58 = pshufhw(auVar60,auVar68,0x84);
        auVar60 = (auVar58 | auVar64 & auVar60) ^ auVar55;
        auVar60 = packssdw(auVar60,auVar60);
        if ((auVar60 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(short *)((long)local_178 + uVar25 * 2 + lVar15 * 2 + 6) = sVar26 + 3;
        }
        auVar60 = auVar50 ^ auVar54;
        iVar67 = -(uint)(iVar35 < auVar60._0_4_);
        auVar62._4_4_ = -(uint)(iVar12 < auVar60._4_4_);
        iVar70 = -(uint)(iVar71 < auVar60._8_4_);
        auVar62._12_4_ = -(uint)(iVar45 < auVar60._12_4_);
        auVar65._4_4_ = iVar67;
        auVar65._0_4_ = iVar67;
        auVar65._8_4_ = iVar70;
        auVar65._12_4_ = iVar70;
        auVar57 = pshuflw(auVar57,auVar65,0xe8);
        auVar61._4_4_ = -(uint)(auVar60._4_4_ == iVar12);
        auVar61._12_4_ = -(uint)(auVar60._12_4_ == iVar45);
        auVar61._0_4_ = auVar61._4_4_;
        auVar61._8_4_ = auVar61._12_4_;
        in_XMM12 = pshuflw(auVar73 & auVar72,auVar61,0xe8);
        in_XMM12 = in_XMM12 & auVar57;
        auVar62._0_4_ = auVar62._4_4_;
        auVar62._8_4_ = auVar62._12_4_;
        auVar57 = pshuflw(auVar57,auVar62,0xe8);
        auVar57 = (auVar57 | in_XMM12) ^ auVar55;
        auVar57 = packssdw(auVar57,auVar57);
        if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(short *)((long)local_178 + uVar25 * 2 + lVar15 * 2 + 8) = sVar26 + 4;
        }
        auVar62 = auVar61 & auVar65 | auVar62;
        auVar57 = packssdw(auVar62,auVar62);
        auVar57 = packssdw(auVar57 ^ auVar55,auVar57 ^ auVar55);
        if ((auVar57 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(short *)((long)local_178 + uVar25 * 2 + lVar15 * 2 + 10) = sVar26 + 5;
        }
        auVar57 = auVar56 ^ auVar54;
        iVar35 = -(uint)(iVar35 < auVar57._0_4_);
        auVar69._4_4_ = -(uint)(iVar12 < auVar57._4_4_);
        iVar71 = -(uint)(iVar71 < auVar57._8_4_);
        auVar69._12_4_ = -(uint)(iVar45 < auVar57._12_4_);
        auVar73._4_4_ = iVar35;
        auVar73._0_4_ = iVar35;
        auVar73._8_4_ = iVar71;
        auVar73._12_4_ = iVar71;
        auVar66._4_4_ = -(uint)(auVar57._4_4_ == iVar12);
        auVar66._12_4_ = -(uint)(auVar57._12_4_ == iVar45);
        auVar66._0_4_ = auVar66._4_4_;
        auVar66._8_4_ = auVar66._12_4_;
        auVar69._0_4_ = auVar69._4_4_;
        auVar69._8_4_ = auVar69._12_4_;
        auVar57 = auVar66 & auVar73 | auVar69;
        auVar57 = packssdw(auVar57,auVar57);
        in_XMM11 = packssdw(auVar57 ^ auVar55,auVar57 ^ auVar55);
        if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(short *)((long)local_178 + uVar25 * 2 + lVar15 * 2 + 0xc) = sVar26 + 6;
        }
        auVar57 = pshufhw(auVar73,auVar73,0x84);
        auVar60 = pshufhw(auVar66,auVar66,0x84);
        auVar72 = pshufhw(auVar57,auVar69,0x84);
        auVar57 = (auVar72 | auVar60 & auVar57) ^ auVar55;
        auVar57 = packssdw(auVar57,auVar57);
        if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(short *)((long)local_178 + uVar25 * 2 + lVar15 * 2 + 0xe) = sVar26 + 7;
        }
        uVar25 = uVar25 + 8;
        lVar19 = auVar53._8_8_;
        auVar53._0_8_ = auVar53._0_8_ + 8;
        auVar53._8_8_ = lVar19 + 8;
        lVar19 = auVar52._8_8_;
        auVar52._0_8_ = auVar52._0_8_ + 8;
        auVar52._8_8_ = lVar19 + 8;
        lVar19 = auVar50._8_8_;
        auVar50._0_8_ = auVar50._0_8_ + 8;
        auVar50._8_8_ = lVar19 + 8;
        lVar19 = auVar56._8_8_;
        auVar56._0_8_ = auVar56._0_8_ + 8;
        auVar56._8_8_ = lVar19 + 8;
      } while ((local_1bc + 7 & 0xfffffff8) != uVar25);
    }
    __s = local_178;
    local_168 = uVar20;
    if (0 < iVar17) {
      lVar19 = 0;
      local_198._0_8_ = ppVVar37;
      local_1a0 = dVar74;
      do {
        pVVar5 = ppVVar37[lVar19];
        if (pVVar5 != (VP8LHistogram *)0x0) {
          uVar20 = (ulong)*(ushort *)((long)__s + lVar19 * 2);
          lVar24 = (long)*(short *)((long)&local_138[0].cur_pos + uVar20 * 4);
          if (lVar24 == -1) {
            *(short *)((long)&local_138[0].cur_pos + uVar20 * 4) = (short)lVar19;
          }
          else {
            ppVVar37 = (VP8LHistogram **)local_198._0_8_;
            if ((int)local_1b8 != 0) {
              pVVar6 = *(VP8LHistogram **)(local_198._0_8_ + lVar24 * 8);
              VP8LHistogramAdd(pVVar5,pVVar6,pVVar6);
              set = local_170;
              uVar13 = pVVar5->trivial_symbol_;
              if (uVar13 != pVVar6->trivial_symbol_) {
                uVar13 = 0xffffffff;
              }
              pVVar6->trivial_symbol_ = uVar13;
              HistogramSetRemoveHistogram(image_histo,(int)lVar19,(int *)&local_1bc);
              *(uint16_t *)((long)pvVar14 + (ulong)histogram_symbols[lVar19] * 2 + lVar15 * 2) =
                   histogram_symbols[lVar24];
              __s = local_178;
              dVar74 = local_1a0;
              goto LAB_0014c15d;
            }
            local_158 = -pVVar5->bit_cost_ * dVar74;
            pVVar6 = *(VP8LHistogram **)(local_198._0_8_ + lVar24 * 8);
            local_1b0.queue = (HistogramPair *)0x0;
            local_148 = (VP8LBackwardRefs *)(pVVar5->bit_cost_ + pVVar6->bit_cost_);
            uStack_150 = 0x8000000000000000;
            uStack_140 = 0;
            iVar17 = GetCombinedHistogramEntropy
                               (pVVar6,pVVar5,local_158 + (double)local_148,(double *)&local_1b0);
            if (iVar17 != 0) {
              VP8LHistogramAdd(pVVar6,pVVar5,local_1c8);
              uVar13 = pVVar6->trivial_symbol_;
              if (uVar13 != pVVar5->trivial_symbol_) {
                uVar13 = 0xffffffff;
              }
              local_1c8->trivial_symbol_ = uVar13;
              local_1c8->bit_cost_ = (double)local_1b0.queue;
              local_1c8->palette_code_bits_ = pVVar6->palette_code_bits_;
            }
            set = local_170;
            __s = local_178;
            dVar74 = local_1a0;
            if ((double)local_1b0.queue - (double)local_148 < local_158) {
              ppVVar37 = (VP8LHistogram **)local_198._0_8_;
              if (((local_1c8->trivial_symbol_ != 0xffffffff) ||
                  (((*(VP8LHistogram **)(local_198._0_8_ + lVar19 * 8))->trivial_symbol_ ==
                    0xffffffff &&
                   ((*(VP8LHistogram **)(local_198._0_8_ + lVar24 * 8))->trivial_symbol_ ==
                    0xffffffff)))) ||
                 (uVar16 = *(ushort *)((long)&local_138[0].cur_pos + uVar20 * 4 + 2), 0x1f < uVar16)
                 ) {
                pVVar5 = *(VP8LHistogram **)(local_198._0_8_ + lVar24 * 8);
                *(VP8LHistogram **)(local_198._0_8_ + lVar24 * 8) = local_1c8;
                HistogramSetRemoveHistogram(image_histo,(int)lVar19,(int *)&local_1bc);
                *(uint16_t *)((long)pvVar14 + (ulong)histogram_symbols[lVar19] * 2 + lVar15 * 2) =
                     histogram_symbols[lVar24];
                __s = local_178;
                dVar74 = local_1a0;
                local_1c8 = pVVar5;
                goto LAB_0014c15d;
              }
              *(ushort *)((long)&local_138[0].cur_pos + uVar20 * 4 + 2) = uVar16 + 1;
            }
          }
          ppVVar37 = (VP8LHistogram **)local_198._0_8_;
        }
LAB_0014c15d:
        lVar19 = lVar19 + 1;
      } while (lVar19 < image_histo->size);
    }
    uVar20 = local_168;
    if (((int)local_1b8 != 0) && (0 < image_histo->size)) {
      lVar19 = 0;
      do {
        if (ppVVar37[lVar19] != (VP8LHistogram *)0x0) {
          UpdateHistogramCost(ppVVar37[lVar19]);
          __s = local_178;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < image_histo->size);
    }
    iVar17 = (int)uVar20;
    if (0 < iVar17) {
      uVar25 = 0;
      bVar8 = false;
      do {
        do {
          bVar9 = bVar8;
          uVar16 = *(ushort *)((long)pvVar14 + uVar25 * 2 + lVar15 * 2);
          uVar4 = *(ushort *)((long)pvVar14 + (ulong)uVar16 * 2 + lVar15 * 2);
          if (uVar16 != uVar4) {
            puVar27 = (ushort *)((long)pvVar14 + (ulong)uVar16 * 2 + lVar15 * 2);
            do {
              uVar16 = *(ushort *)((long)pvVar14 + (ulong)uVar4 * 2 + lVar15 * 2);
              *puVar27 = uVar16;
              puVar27 = (ushort *)((long)pvVar14 + (ulong)uVar16 * 2 + lVar15 * 2);
              uVar4 = *puVar27;
            } while (uVar16 != uVar4);
          }
          if (uVar16 != *(ushort *)((long)pvVar14 + uVar25 * 2 + lVar15 * 2)) {
            *(ushort *)((long)pvVar14 + uVar25 * 2 + lVar15 * 2) = uVar16;
            bVar9 = true;
          }
          uVar25 = uVar25 + 1;
          bVar8 = bVar9;
        } while (uVar25 != uVar20);
        if (iVar17 < 1) break;
        uVar25 = 0;
        bVar8 = false;
      } while (bVar9);
    }
    sVar26 = 0;
    memset(__s,0,(long)image_histo->max_size * 2);
    iVar17 = image_histo->max_size;
    bVar28 = (byte)local_160;
    if (0 < (long)iVar17) {
      lVar19 = 0;
      do {
        if ((ulong)histogram_symbols[lVar19] != 0xffff) {
          uVar20 = (ulong)*(ushort *)
                           ((long)pvVar14 + (ulong)histogram_symbols[lVar19] * 2 + lVar15 * 2);
          if ((uVar20 != 0) && (*(short *)((long)local_178 + uVar20 * 2) == 0)) {
            sVar26 = sVar26 + 1;
            *(short *)((long)local_178 + uVar20 * 2) = sVar26;
          }
          histogram_symbols[lVar19] = *(uint16_t *)((long)local_178 + uVar20 * 2);
        }
        lVar19 = lVar19 + 1;
      } while (iVar17 != lVar19);
    }
  }
  uVar30 = local_1bc;
  if (((int)local_1b8 != 0 & bVar28) == 0) {
    fVar39 = (float)local_180 / 100.0;
    iVar17 = (int)(fVar39 * fVar39 * fVar39 * 99.0 + 1.0);
    nmemb = (uint64_t)(int)local_1bc;
    bVar8 = false;
    cVar38 = '\0';
    if (iVar17 <= (int)local_1bc) {
      ppVVar37 = image_histo->histograms;
      local_1b8 = (HistogramPair *)WebPSafeMalloc(nmemb,4);
      if (local_1b8 == (HistogramPair *)0x0) {
        cVar38 = '\x01';
      }
      else {
        local_1b0.size = 0;
        local_1b0.max_size = 9;
        local_1b0.queue = (HistogramPair *)WebPSafeMalloc(10,0x18);
        cVar38 = local_1b0.queue == (HistogramPair *)0x0;
        if (!(bool)cVar38) {
          if (0 < image_histo->size) {
            lVar19 = 0;
            iVar35 = 0;
            do {
              if (ppVVar37[lVar19] != (VP8LHistogram *)0x0) {
                lVar15 = (long)iVar35;
                iVar35 = iVar35 + 1;
                (&local_1b8->idx1)[lVar15] = (int)lVar19;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < image_histo->size);
          }
          local_168 = CONCAT44(local_168._4_4_,(uint)(byte)cVar38);
          dVar74 = local_158;
          if (0 < (int)uVar30) {
            local_158._0_4_ = (int)uVar30 / 2;
            uVar20 = 1;
            iVar12 = 0;
            iVar35 = 0;
            local_148 = (VP8LBackwardRefs *)CONCAT44(local_148._4_4_,iVar17);
            local_160 = nmemb;
            do {
              uVar30 = local_1bc;
              __nmemb = (size_t)(int)local_1bc;
              dVar74 = (double)CONCAT44(local_158._4_4_,(uint)local_158);
              if (((int)local_1bc < iVar17) ||
                 (dVar74 = (double)CONCAT44(local_158._4_4_,(uint)local_158),
                 (int)(uint)local_158 <= iVar35 + 1)) break;
              if (local_1b0.size == 0) {
                dVar74 = 0.0;
              }
              else {
                dVar74 = (local_1b0.queue)->cost_diff;
              }
              auVar54._8_8_ = 0;
              auVar54._0_8_ = dVar74;
              local_1a0 = (double)CONCAT44(local_1a0._4_4_,iVar35 + 1);
              local_17c = 1;
              local_180 = iVar12;
              if (1 < (int)local_1bc) {
                uVar36 = (local_1bc - 1) * local_1bc;
                iVar35 = (int)local_1bc / 2;
                uVar33 = local_1bc - 1;
                iVar17 = 1;
                do {
                  uVar18 = (uint)((uVar20 * 0xbc8f) / 0x7fffffff);
                  uVar20 = (ulong)((int)(uVar20 * 0xbc8f) + (uVar18 << 0x1f | uVar18));
                  uVar32 = uVar20 % (ulong)uVar36;
                  uVar25 = uVar32 / uVar33;
                  uVar18 = (uint)(uVar32 % (ulong)uVar33);
                  local_198 = auVar54;
                  dVar74 = HistoQueuePush(&local_1b0,ppVVar37,(&local_1b8->idx1)[uVar25],
                                          (&local_1b8->idx1)
                                          [(uVar18 + 1) - (uint)(uVar18 < (uint)uVar25)],
                                          auVar54._0_8_);
                  if (dVar74 < 0.0) {
                    if (local_1b0.size == local_1b0.max_size) break;
                  }
                  if ((int)uVar30 < 2) break;
                  auVar51._0_8_ = local_198._0_8_ & -(ulong)(0.0 <= dVar74);
                  auVar51._8_8_ = local_198._8_8_ & extraout_XMM0_Qb;
                  auVar47._0_8_ = ~-(ulong)(0.0 <= dVar74) & (ulong)dVar74;
                  auVar47._8_8_ = 0;
                  auVar54 = auVar51 | auVar47;
                  bVar8 = iVar17 < iVar35;
                  iVar17 = iVar17 + 1;
                } while (bVar8);
              }
              pHVar2 = local_1b0.queue;
              pHVar34 = local_1b8;
              iVar17 = local_1b0.size;
              iVar35 = local_1a0._0_4_;
              if (local_1b0.size != 0) {
                dVar74 = (double)(long)(local_1b0.queue)->idx1;
                local_17c = (local_1b0.queue)->idx2;
                pvVar14 = bsearch(&local_17c,local_1b8,__nmemb,4,PairComparison);
                memmove(pvVar14,(void *)((long)pvVar14 + 4),
                        (((ulong)~((long)pvVar14 - (long)pHVar34) >> 2) + __nmemb) * 4);
                local_198._0_8_ = ppVVar37[(int)local_17c];
                pVVar5 = ppVVar37[(long)dVar74];
                VP8LHistogramAdd(ppVVar37[(int)local_17c],pVVar5,pVVar5);
                uVar13 = *(uint32_t *)(local_198._0_8_ + 0xcac);
                if (uVar13 != pVVar5->trivial_symbol_) {
                  uVar13 = 0xffffffff;
                }
                pVVar5->trivial_symbol_ = uVar13;
                ppVVar37[(long)dVar74]->bit_cost_ = pHVar2->cost_combo;
                HistogramSetRemoveHistogram(image_histo,local_17c,(int *)&local_1bc);
                if (0 < iVar17) {
                  iVar35 = 0;
                  local_1a0 = dVar74;
                  do {
                    pHVar34 = pHVar2 + iVar35;
                    uVar30 = pHVar34->idx1;
                    uVar33 = pHVar34->idx2;
                    uVar36 = SUB84(dVar74,0);
                    if ((uVar30 != local_17c && uVar30 != uVar36) ||
                       (uVar33 != local_17c && uVar33 != uVar36)) {
                      if (uVar30 != local_17c && uVar30 != uVar36) {
                        bVar8 = true;
                        if (uVar33 == local_17c || uVar33 == uVar36) {
                          pHVar34->idx2 = uVar36;
                          goto LAB_0014c650;
                        }
                      }
                      else {
                        pHVar34->idx1 = uVar36;
LAB_0014c650:
                        bVar8 = false;
                      }
                      iVar12 = pHVar34->idx2;
                      if (iVar12 < pHVar34->idx1) {
                        pHVar34->idx2 = pHVar34->idx1;
                        pHVar34->idx1 = iVar12;
                      }
                      if (!bVar8) {
                        pVVar5 = ppVVar37[pHVar34->idx1];
                        pVVar6 = ppVVar37[pHVar34->idx2];
                        dVar74 = pVVar5->bit_cost_ + pVVar6->bit_cost_;
                        local_198._0_8_ = dVar74;
                        pHVar34->cost_combo = 0.0;
                        GetCombinedHistogramEntropy(pVVar5,pVVar6,dVar74 + 0.0,&pHVar34->cost_combo)
                        ;
                        dVar41 = pHVar34->cost_combo - (double)local_198._0_8_;
                        pHVar34->cost_diff = dVar41;
                        dVar74 = local_1a0;
                        if (0.0 <= dVar41) goto LAB_0014c622;
                      }
                      if (pHVar34->cost_diff <= pHVar2->cost_diff &&
                          pHVar2->cost_diff != pHVar34->cost_diff) {
                        local_138[0].last_pos_ = (PixOrCopy *)pHVar2->cost_combo;
                        local_138[0].cur_pos = *(PixOrCopy **)pHVar2;
                        local_138[0].cur_block_ = (PixOrCopyBlock *)pHVar2->cost_diff;
                        pHVar2->cost_combo = pHVar34->cost_combo;
                        iVar12 = pHVar34->idx2;
                        dVar41 = pHVar34->cost_diff;
                        pHVar2->idx1 = pHVar34->idx1;
                        pHVar2->idx2 = iVar12;
                        pHVar2->cost_diff = dVar41;
                        pHVar34->cost_combo = (double)local_138[0].last_pos_;
                        *(PixOrCopy **)pHVar34 = local_138[0].cur_pos;
                        pHVar34->cost_diff = (double)local_138[0].cur_block_;
                      }
                      iVar35 = iVar35 + 1;
                    }
                    else {
LAB_0014c622:
                      pHVar34->cost_combo = pHVar2[(long)iVar17 + -1].cost_combo;
                      pHVar1 = pHVar2 + (long)iVar17 + -1;
                      iVar12 = pHVar1->idx2;
                      dVar41 = pHVar1->cost_diff;
                      pHVar34->idx1 = pHVar1->idx1;
                      pHVar34->idx2 = iVar12;
                      pHVar34->cost_diff = dVar41;
                      iVar17 = iVar17 + -1;
                    }
                  } while (iVar35 < iVar17);
                }
                local_1b0.size = iVar17;
                iVar35 = 0;
              }
              iVar12 = local_180 + 1;
              set = local_170;
              iVar17 = (int)local_148;
              dVar74 = (double)CONCAT44(local_158._4_4_,(uint)local_158);
            } while (iVar12 != (int)local_160);
          }
          local_158 = dVar74;
          bVar8 = iVar17 < (int)local_1bc;
          cVar38 = (char)local_168;
        }
        WebPSafeFree(local_1b0.queue);
        local_1b0.size = 0;
        local_1b0.max_size = 0;
        WebPSafeFree(local_1b8);
      }
    }
    iVar17 = 0;
    if (cVar38 != '\0') goto LAB_0014c942;
    if (!bVar8) {
      iVar17 = image_histo->size;
      if ((long)iVar17 < 1) {
        uVar20 = 0;
      }
      else {
        lVar19 = 0;
        uVar25 = 0;
        do {
          pVVar5 = image_histo->histograms[lVar19];
          uVar20 = uVar25;
          if (pVVar5 != (VP8LHistogram *)0x0) {
            uVar20 = (ulong)((int)uVar25 + 1);
            image_histo->histograms[uVar25] = pVVar5;
          }
          lVar19 = lVar19 + 1;
          uVar25 = uVar20;
        } while (iVar17 != lVar19);
      }
      iVar17 = (int)uVar20;
      image_histo->size = iVar17;
      local_198._0_8_ = image_histo->histograms;
      local_1b0._8_8_ = (ulong)(uint)(iVar17 * iVar17) << 0x20;
      local_1b0.queue = (HistogramPair *)WebPSafeMalloc((ulong)(iVar17 * iVar17 + 1),0x18);
      if (local_1b0.queue == (HistogramPair *)0x0) {
        WebPSafeFree((void *)0x0);
      }
      else {
        local_1b8 = local_1b0.queue;
        if (0 < iVar17) {
          uVar32 = 1;
          uVar25 = 0;
          do {
            uVar22 = uVar25 + 1;
            uVar23 = uVar32;
            if (uVar22 < uVar20 && image_histo->histograms[uVar25] != (VP8LHistogram *)0x0) {
              do {
                if (image_histo->histograms[uVar23] != (VP8LHistogram *)0x0) {
                  HistoQueuePush(&local_1b0,(VP8LHistogram **)local_198._0_8_,(int)uVar25,
                                 (int)uVar23,0.0);
                }
                uVar23 = uVar23 + 1;
              } while (uVar20 != uVar23);
            }
            uVar32 = uVar32 + 1;
            uVar25 = uVar22;
          } while (uVar22 != uVar20);
        }
        while (pHVar34 = local_1b0.queue, 0 < local_1b0.size) {
          uVar30 = (local_1b0.queue)->idx1;
          uVar33 = (local_1b0.queue)->idx2;
          uVar10 = local_198._0_8_;
          pVVar5 = *(VP8LHistogram **)(local_198._0_8_ + (long)(int)uVar33 * 8);
          pVVar6 = *(VP8LHistogram **)(local_198._0_8_ + (long)(int)uVar30 * 8);
          VP8LHistogramAdd(pVVar5,pVVar6,pVVar6);
          uVar13 = pVVar5->trivial_symbol_;
          if (uVar13 != pVVar6->trivial_symbol_) {
            uVar13 = 0xffffffff;
          }
          pVVar6->trivial_symbol_ = uVar13;
          *(double *)(*(long *)(uVar10 + (long)(int)uVar30 * 8) + 0xcb0) = pHVar34->cost_combo;
          HistogramSetRemoveHistogram(image_histo,uVar33,(int *)&local_1bc);
          iVar17 = local_1b0.size;
          if (0 < local_1b0.size) {
            iVar35 = 0;
            do {
              pHVar2 = pHVar34 + iVar35;
              if ((((pHVar2->idx1 == uVar30) || (pHVar2->idx2 == uVar33)) ||
                  (pHVar2->idx1 == uVar33)) || (pHVar2->idx2 == uVar30)) {
                pHVar2->cost_combo = pHVar34[(long)iVar17 + -1].cost_combo;
                pHVar1 = pHVar34 + (long)iVar17 + -1;
                iVar12 = pHVar1->idx2;
                dVar74 = pHVar1->cost_diff;
                pHVar2->idx1 = pHVar1->idx1;
                pHVar2->idx2 = iVar12;
                pHVar2->cost_diff = dVar74;
                iVar17 = iVar17 + -1;
              }
              else {
                if (pHVar2->cost_diff <= pHVar34->cost_diff &&
                    pHVar34->cost_diff != pHVar2->cost_diff) {
                  local_138[0].last_pos_ = (PixOrCopy *)pHVar34->cost_combo;
                  local_138[0].cur_pos = *(PixOrCopy **)pHVar34;
                  local_138[0].cur_block_ = (PixOrCopyBlock *)pHVar34->cost_diff;
                  pHVar34->cost_combo = pHVar2->cost_combo;
                  iVar12 = pHVar2->idx2;
                  dVar74 = pHVar2->cost_diff;
                  pHVar34->idx1 = pHVar2->idx1;
                  pHVar34->idx2 = iVar12;
                  pHVar34->cost_diff = dVar74;
                  pHVar2->cost_combo = (double)local_138[0].last_pos_;
                  *(PixOrCopy **)pHVar2 = local_138[0].cur_pos;
                  pHVar2->cost_diff = (double)local_138[0].cur_block_;
                }
                iVar35 = iVar35 + 1;
              }
            } while (iVar35 < iVar17);
          }
          local_1b0.size = iVar17;
          if (0 < image_histo->size) {
            uVar20 = 0;
            do {
              if ((uVar30 != uVar20) && (image_histo->histograms[uVar20] != (VP8LHistogram *)0x0)) {
                HistoQueuePush(&local_1b0,image_histo->histograms,uVar30,(int)uVar20,0.0);
              }
              uVar20 = uVar20 + 1;
            } while ((long)uVar20 < (long)image_histo->size);
          }
        }
        WebPSafeFree(local_1b0.queue);
        set = local_170;
        if (local_1b8 != (HistogramPair *)0x0) goto LAB_0014c2b0;
      }
LAB_0014b7ff:
      iVar17 = 0;
      goto LAB_0014c942;
    }
  }
LAB_0014c2b0:
  iVar17 = image_histo->size;
  if ((long)iVar17 < 1) {
    uVar30 = 0;
  }
  else {
    lVar19 = 0;
    uVar20 = 0;
    do {
      pVVar5 = image_histo->histograms[lVar19];
      uVar25 = uVar20;
      if (pVVar5 != (VP8LHistogram *)0x0) {
        uVar25 = (ulong)((int)uVar20 + 1);
        image_histo->histograms[uVar20] = pVVar5;
      }
      uVar30 = (uint)uVar25;
      lVar19 = lVar19 + 1;
      uVar20 = uVar25;
    } while (iVar17 != lVar19);
  }
  image_histo->size = uVar30;
  ppVVar37 = set->histograms;
  ppVVar7 = image_histo->histograms;
  uVar33 = image_histo->max_size;
  uVar20 = (ulong)uVar33;
  local_1b8 = (HistogramPair *)CONCAT44(local_1b8._4_4_,uVar30);
  if ((int)uVar30 < 2) {
    if (0 < (int)uVar33) {
      memset(histogram_symbols,0,uVar20 * 2);
    }
  }
  else if (0 < (int)uVar33) {
    uVar25 = 0;
    do {
      if (ppVVar37[uVar25] == (VP8LHistogram *)0x0) {
        histogram_symbols[uVar25] = histogram_symbols[uVar25 - 1];
      }
      else {
        uVar22 = 0;
        uVar32 = 0;
        auVar43 = ZEXT816(0x47d2ced32a16a1b1);
        do {
          local_198._0_8_ = auVar43._0_8_;
          pVVar5 = ppVVar7[uVar22];
          local_138[0].cur_pos = (PixOrCopy *)((ulong)pVVar5->bit_cost_ ^ 0x8000000000000000);
          GetCombinedHistogramEntropy(pVVar5,ppVVar37[uVar25],auVar43._0_8_,(double *)local_138);
          pPVar3 = local_138[0].cur_pos;
          if ((double)local_198._0_8_ <= (double)local_138[0].cur_pos && uVar22 != 0) {
            pPVar3 = (PixOrCopy *)local_198._0_8_;
          }
          auVar43._8_8_ = 0;
          auVar43._0_8_ = pPVar3;
          if ((double)local_198._0_8_ > (double)local_138[0].cur_pos || uVar22 == 0) {
            uVar32 = uVar22 & 0xffffffff;
          }
          uVar22 = uVar22 + 1;
        } while (uVar30 != uVar22);
        histogram_symbols[uVar25] = (uint16_t)uVar32;
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar20);
  }
  VP8LHistogramSetClear(image_histo);
  image_histo->size = (int)local_1b8;
  iVar17 = 1;
  set = local_170;
  if (0 < (int)uVar33) {
    uVar25 = 0;
    do {
      pVVar5 = ppVVar37[uVar25];
      if (pVVar5 != (VP8LHistogram *)0x0) {
        pVVar6 = ppVVar7[histogram_symbols[uVar25]];
        VP8LHistogramAdd(pVVar5,pVVar6,pVVar6);
        uVar13 = pVVar5->trivial_symbol_;
        if (uVar13 != pVVar6->trivial_symbol_) {
          uVar13 = 0xffffffff;
        }
        pVVar6->trivial_symbol_ = uVar13;
      }
      uVar25 = uVar25 + 1;
    } while (uVar20 != uVar25);
    iVar17 = 1;
    set = local_170;
  }
LAB_0014c942:
  WebPSafeFree(set);
  WebPSafeFree(local_178);
  return iVar17;
}

Assistant:

int VP8LGetHistoImageSymbols(int xsize, int ysize,
                             const VP8LBackwardRefs* const refs,
                             int quality, int low_effort,
                             int histogram_bits, int cache_bits,
                             VP8LHistogramSet* const image_histo,
                             VP8LHistogram* const tmp_histo,
                             uint16_t* const histogram_symbols) {
  int ok = 0;
  const int histo_xsize =
      histogram_bits ? VP8LSubSampleSize(xsize, histogram_bits) : 1;
  const int histo_ysize =
      histogram_bits ? VP8LSubSampleSize(ysize, histogram_bits) : 1;
  const int image_histo_raw_size = histo_xsize * histo_ysize;
  VP8LHistogramSet* const orig_histo =
      VP8LAllocateHistogramSet(image_histo_raw_size, cache_bits);
  // Don't attempt linear bin-partition heuristic for
  // histograms of small sizes (as bin_map will be very sparse) and
  // maximum quality q==100 (to preserve the compression gains at that level).
  const int entropy_combine_num_bins = low_effort ? NUM_PARTITIONS : BIN_SIZE;
  int entropy_combine;
  uint16_t* const map_tmp =
      WebPSafeMalloc(2 * image_histo_raw_size, sizeof(map_tmp));
  uint16_t* const cluster_mappings = map_tmp + image_histo_raw_size;
  int num_used = image_histo_raw_size;
  if (orig_histo == NULL || map_tmp == NULL) goto Error;

  // Construct the histograms from backward references.
  HistogramBuild(xsize, histogram_bits, refs, orig_histo);
  // Copies the histograms and computes its bit_cost.
  // histogram_symbols is optimized
  HistogramCopyAndAnalyze(orig_histo, image_histo, &num_used,
                          histogram_symbols);

  entropy_combine =
      (num_used > entropy_combine_num_bins * 2) && (quality < 100);

  if (entropy_combine) {
    uint16_t* const bin_map = map_tmp;
    const double combine_cost_factor =
        GetCombineCostFactor(image_histo_raw_size, quality);
    const uint32_t num_clusters = num_used;

    HistogramAnalyzeEntropyBin(image_histo, bin_map, low_effort);
    // Collapse histograms with similar entropy.
    HistogramCombineEntropyBin(image_histo, &num_used, histogram_symbols,
                               cluster_mappings, tmp_histo, bin_map,
                               entropy_combine_num_bins, combine_cost_factor,
                               low_effort);
    OptimizeHistogramSymbols(image_histo, cluster_mappings, num_clusters,
                             map_tmp, histogram_symbols);
  }

  // Don't combine the histograms using stochastic and greedy heuristics for
  // low-effort compression mode.
  if (!low_effort || !entropy_combine) {
    const float x = quality / 100.f;
    // cubic ramp between 1 and MAX_HISTO_GREEDY:
    const int threshold_size = (int)(1 + (x * x * x) * (MAX_HISTO_GREEDY - 1));
    int do_greedy;
    if (!HistogramCombineStochastic(image_histo, &num_used, threshold_size,
                                    &do_greedy)) {
      goto Error;
    }
    if (do_greedy) {
      RemoveEmptyHistograms(image_histo);
      if (!HistogramCombineGreedy(image_histo, &num_used)) {
        goto Error;
      }
    }
  }

  // Find the optimal map from original histograms to the final ones.
  RemoveEmptyHistograms(image_histo);
  HistogramRemap(orig_histo, image_histo, histogram_symbols);

  ok = 1;

 Error:
  VP8LFreeHistogramSet(orig_histo);
  WebPSafeFree(map_tmp);
  return ok;
}